

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3243::GetStateBlock
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *mD)

{
  element_type *peVar1;
  double *pdVar2;
  Index index;
  ulong uVar3;
  ulong uVar4;
  
  if (2 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar3 = 3;
    if ((((ulong)pdVar2 & 7) == 0) &&
       (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
      uVar3 = uVar4;
    }
    peVar1 = (((this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x20);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    if (uVar3 < 3) {
      do {
        pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x20);
        uVar3 = uVar3 + 1;
      } while (uVar3 != 3);
    }
    if (5 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 3;
      uVar3 = 3;
      if ((((ulong)pdVar2 & 7) == 0) &&
         (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
        uVar3 = uVar4;
      }
      peVar1 = (((this->m_nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0xf0);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      if (uVar3 < 3) {
        do {
          pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0xf0);
          uVar3 = uVar3 + 1;
        } while (uVar3 != 3);
      }
      if (8 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 6;
        uVar3 = 3;
        if ((((ulong)pdVar2 & 7) == 0) &&
           (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
          uVar3 = uVar4;
        }
        peVar1 = (((this->m_nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x140);
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        if (uVar3 < 3) {
          do {
            pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x140);
            uVar3 = uVar3 + 1;
          } while (uVar3 != 3);
        }
        if (0xb < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
          pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + 9;
          uVar3 = 3;
          if ((((ulong)pdVar2 & 7) == 0) &&
             (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
            uVar3 = uVar4;
          }
          peVar1 = (((this->m_nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (uVar3 != 0) {
            uVar4 = 0;
            do {
              pdVar2[uVar4] = *(double *)((long)&peVar1->DDD_dt + uVar4 * 8 + 0xffffffffffffffe8);
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          if (uVar3 < 3) {
            do {
              pdVar2[uVar3] = *(double *)((long)&peVar1->DDD_dt + uVar3 * 8 + 0xffffffffffffffe8);
              uVar3 = uVar3 + 1;
            } while (uVar3 != 3);
          }
          if (0xe < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows) {
            pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data + 0xc;
            uVar3 = 3;
            if ((((ulong)pdVar2 & 7) == 0) &&
               (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
              uVar3 = uVar4;
            }
            peVar1 = (this->m_nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (uVar3 != 0) {
              uVar4 = 0;
              do {
                pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x20);
                uVar4 = uVar4 + 1;
              } while (uVar3 != uVar4);
            }
            if (uVar3 < 3) {
              do {
                pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x20);
                uVar3 = uVar3 + 1;
              } while (uVar3 != 3);
            }
            if (0x11 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows) {
              pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + 0xf;
              uVar3 = 3;
              if ((((ulong)pdVar2 & 7) == 0) &&
                 (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
                uVar3 = uVar4;
              }
              peVar1 = (this->m_nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if (uVar3 != 0) {
                uVar4 = 0;
                do {
                  pdVar2[uVar4] =
                       *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0xf0);
                  uVar4 = uVar4 + 1;
                } while (uVar3 != uVar4);
              }
              if (uVar3 < 3) {
                do {
                  pdVar2[uVar3] =
                       *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0xf0);
                  uVar3 = uVar3 + 1;
                } while (uVar3 != 3);
              }
              if (0x14 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows) {
                pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + 0x12;
                uVar3 = 3;
                if ((((ulong)pdVar2 & 7) == 0) &&
                   (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
                  uVar3 = uVar4;
                }
                peVar1 = (this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                if (uVar3 != 0) {
                  uVar4 = 0;
                  do {
                    pdVar2[uVar4] =
                         *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x140);
                    uVar4 = uVar4 + 1;
                  } while (uVar3 != uVar4);
                }
                if (uVar3 < 3) {
                  do {
                    pdVar2[uVar3] =
                         *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x140);
                    uVar3 = uVar3 + 1;
                  } while (uVar3 != 3);
                }
                if (0x17 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows) {
                  pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data + 0x15;
                  uVar3 = 3;
                  if ((((ulong)pdVar2 & 7) == 0) &&
                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
                    uVar3 = uVar4;
                  }
                  peVar1 = (this->m_nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  if (uVar3 != 0) {
                    uVar4 = 0;
                    do {
                      pdVar2[uVar4] =
                           *(double *)((long)&peVar1->DDD_dt + uVar4 * 8 + 0xffffffffffffffe8);
                      uVar4 = uVar4 + 1;
                    } while (uVar3 != uVar4);
                  }
                  if (uVar3 < 3) {
                    do {
                      pdVar2[uVar3] =
                           *(double *)((long)&peVar1->DDD_dt + uVar3 * 8 + 0xffffffffffffffe8);
                      uVar3 = uVar3 + 1;
                    } while (uVar3 != 3);
                  }
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementBeamANCF_3243::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.segment(0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(3, 3) = m_nodes[0]->GetD().eigen();
    mD.segment(6, 3) = m_nodes[0]->GetDD().eigen();
    mD.segment(9, 3) = m_nodes[0]->GetDDD().eigen();

    mD.segment(12, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(15, 3) = m_nodes[1]->GetD().eigen();
    mD.segment(18, 3) = m_nodes[1]->GetDD().eigen();
    mD.segment(21, 3) = m_nodes[1]->GetDDD().eigen();
}